

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O0

void __thiscall
unitNameDefinitions_customaryDuplicates_Test::~unitNameDefinitions_customaryDuplicates_Test
          (unitNameDefinitions_customaryDuplicates_Test *this)

{
  unitNameDefinitions_customaryDuplicates_Test *this_local;
  
  ~unitNameDefinitions_customaryDuplicates_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitNameDefinitions, customaryDuplicates)
{
    std::unordered_map<units::unit, std::string> testMap;
    for (const auto& ustring : units::defined_unit_names_customary) {
        if (ustring.second == nullptr) {
            continue;
        }
        auto res = testMap.emplace(ustring.first, ustring.second);
        EXPECT_TRUE(res.second) << "duplicate unit string " << ustring.second
                                << " matching with " << res.first->second;
    }
}